

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_entry_openbyindex(zip_t *zip,int index)

{
  uint uVar1;
  mz_zip_internal_state *pmVar2;
  void *pvVar3;
  mz_bool mVar4;
  char *pcVar5;
  int iVar6;
  undefined1 auVar7 [16];
  mz_zip_archive_file_stat stats;
  
  iVar6 = -1;
  if ((((zip != (zip_t *)0x0) && (-1 < index)) && ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING)
      ) && ((uint)index < (zip->archive).m_total_files)) {
    pmVar2 = (zip->archive).m_pState;
    pvVar3 = (pmVar2->m_central_dir).m_p;
    if (pvVar3 != (void *)0x0) {
      uVar1 = *(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)(uint)index * 4);
      pcVar5 = strrpl((char *)((long)pvVar3 + (ulong)uVar1 + 0x2e),
                      (ulong)*(ushort *)((long)pvVar3 + (ulong)uVar1 + 0x1c),(char)index,(char)uVar1
                     );
      (zip->entry).name = pcVar5;
      if (pcVar5 != (char *)0x0) {
        mVar4 = mz_zip_reader_file_stat(&zip->archive,index,&stats);
        if (mVar4 != 0) {
          (zip->entry).index = index;
          auVar7._0_8_ = stats.m_uncomp_size;
          auVar7._8_4_ = (int)stats.m_comp_size;
          auVar7._12_4_ = stats.m_comp_size._4_4_;
          (zip->entry).uncomp_size = auVar7._0_8_;
          (zip->entry).comp_size = auVar7._8_8_;
          (zip->entry).uncomp_crc32 = stats.m_crc32;
          (zip->entry).offset = (ulong)stats.m_central_dir_ofs;
          (zip->entry).header_offset = stats.m_local_header_ofs;
          (zip->entry).method = stats.m_method;
          (zip->entry).external_attr = stats.m_external_attr;
          (zip->entry).m_time = stats.m_time;
          iVar6 = 0;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int zip_entry_openbyindex(struct zip_t *zip, int index) {
  mz_zip_archive *pZip = NULL;
  mz_zip_archive_file_stat stats;
  mz_uint namelen;
  const mz_uint8 *pHeader;
  const char *pFilename;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  pZip = &(zip->archive);
  if (pZip->m_zip_mode != MZ_ZIP_MODE_READING) {
    // open by index requires readonly mode
    return -1;
  }

  if (index < 0 || (mz_uint)index >= pZip->m_total_files) {
    // index out of range
    return -1;
  }

  if (!(pHeader = &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, index)))) {
    // cannot find header in central directory
    return -1;
  }

  namelen = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;

  /*
    .ZIP File Format Specification Version: 6.3.3

    4.4.17.1 The name of the file, with optional relative path.
    The path stored MUST not contain a drive or
    device letter, or a leading slash.  All slashes
    MUST be forward slashes '/' as opposed to
    backwards slashes '\' for compatibility with Amiga
    and UNIX file systems etc.  If input came from standard
    input, there is no file name field.
  */
  zip->entry.name = strrpl(pFilename, namelen, '\\', '/');
  if (!zip->entry.name) {
    // local entry name is NULL
    return -1;
  }

  if (!mz_zip_reader_file_stat(pZip, (mz_uint)index, &stats)) {
    return -1;
  }

  zip->entry.index = index;
  zip->entry.comp_size = stats.m_comp_size;
  zip->entry.uncomp_size = stats.m_uncomp_size;
  zip->entry.uncomp_crc32 = stats.m_crc32;
  zip->entry.offset = stats.m_central_dir_ofs;
  zip->entry.header_offset = stats.m_local_header_ofs;
  zip->entry.method = stats.m_method;
  zip->entry.external_attr = stats.m_external_attr;
  zip->entry.m_time = stats.m_time;

  return 0;
}